

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Status json_serialize_to_file_pretty(JSON_Value *value,char *filename)

{
  int iVar1;
  char *__s;
  FILE *__stream;
  char *in_RSI;
  char *serialized_string;
  FILE *fp;
  JSON_Status return_code;
  JSON_Status local_1c;
  JSON_Status local_4;
  
  local_1c = 0;
  __s = json_serialize_to_string_pretty((JSON_Value *)0x0);
  if (__s == (char *)0x0) {
    local_4 = -1;
  }
  else {
    __stream = fopen(in_RSI,"w");
    if (__stream == (FILE *)0x0) {
      json_free_serialized_string((char *)0x285d48);
      local_4 = -1;
    }
    else {
      iVar1 = fputs(__s,__stream);
      if (iVar1 == -1) {
        local_1c = -1;
      }
      iVar1 = fclose(__stream);
      if (iVar1 == -1) {
        local_1c = -1;
      }
      json_free_serialized_string((char *)0x285d8f);
      local_4 = local_1c;
    }
  }
  return local_4;
}

Assistant:

JSON_Status json_serialize_to_file_pretty(const JSON_Value *value, const char *filename) {
    JSON_Status return_code = JSONSuccess;
    FILE *fp = NULL;
    char *serialized_string = json_serialize_to_string_pretty(value);
    if (serialized_string == NULL) {
        return JSONFailure;
    }
    fp = fopen(filename, "w");
    if (fp == NULL) {
        json_free_serialized_string(serialized_string);
        return JSONFailure;
    }
    if (fputs(serialized_string, fp) == EOF) {
        return_code = JSONFailure;
    }
    if (fclose(fp) == EOF) {
        return_code = JSONFailure;
    }
    json_free_serialized_string(serialized_string);
    return return_code;
}